

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

void RemoveQueueEntries(SstStream Stream)

{
  _CPTimestepEntry *p_Var1;
  bool bVar2;
  SstStream in_RDI;
  CPTimestepList ItemToFree;
  int Freed;
  CPTimestepList Next;
  CPTimestepList Last;
  CPTimestepList List;
  int AnythingRemoved;
  CPTimestepList local_20;
  CPTimestepList local_18;
  int local_c;
  
  local_c = 0;
  local_20 = (CPTimestepList)0x0;
  p_Var1 = in_RDI->QueuedTimesteps;
  while (local_18 = p_Var1, local_18 != (CPTimestepList)0x0) {
    p_Var1 = local_18->Next;
    bVar2 = false;
    if (((local_18->Expired != 0) && (local_18->PreciousTimestep == 0)) &&
       (local_18->ReferenceCount == 0)) {
      bVar2 = true;
      if (local_18->DPRegistered != 0) {
        (*in_RDI->DP_Interface->releaseTimestep)(&Svcs,in_RDI->DP_Stream,local_18->Timestep);
      }
      in_RDI->QueuedTimestepCount = in_RDI->QueuedTimestepCount + -1;
      if (local_18->MetaDataSendCount != 0) {
        (in_RDI->Stats).TimestepsDelivered = (in_RDI->Stats).TimestepsDelivered + 1;
      }
      CP_verbose(in_RDI,PerRankVerbose,
                 "Remove queue Entries removing Timestep %ld (exp %d, Prec %d, Ref %d), Count now %d\n"
                 ,local_18->Timestep,(ulong)(uint)local_18->Expired,
                 (ulong)(uint)local_18->PreciousTimestep,local_18->ReferenceCount,
                 in_RDI->QueuedTimestepCount);
      (*local_18->FreeTimestep)(local_18->FreeClientData);
      free(local_18->Msg);
      free(local_18->DataBlockToFree);
      free(local_18);
      local_c = local_c + 1;
      if (local_20 == (CPTimestepList)0x0) {
        in_RDI->QueuedTimesteps = p_Var1;
      }
      else {
        local_20->Next = p_Var1;
      }
    }
    if (!bVar2) {
      local_20 = local_18;
    }
  }
  if (local_c != 0) {
    pthread_cond_signal((pthread_cond_t *)&in_RDI->DataCondition);
  }
  return;
}

Assistant:

static void RemoveQueueEntries(SstStream Stream)
{
    int AnythingRemoved = 0;
    CPTimestepList List = Stream->QueuedTimesteps;
    CPTimestepList Last = NULL;

    while (List)
    {
        CPTimestepList Next = List->Next;
        int Freed = 0;
        if (List->Expired && (!List->PreciousTimestep) && (List->ReferenceCount == 0))
        {
            CPTimestepList ItemToFree = List;
            Freed = 1;
            if (ItemToFree->DPRegistered)
            {
                Stream->DP_Interface->releaseTimestep(&Svcs, Stream->DP_Stream, List->Timestep);
            }

            Stream->QueuedTimestepCount--;
            if (ItemToFree->MetaDataSendCount)
            {
                Stream->Stats.TimestepsDelivered++;
            }
            CP_verbose(Stream, PerRankVerbose,
                       "Remove queue Entries removing Timestep %ld (exp %d, "
                       "Prec %d, Ref %d), Count now %d\n",
                       ItemToFree->Timestep, ItemToFree->Expired, ItemToFree->PreciousTimestep,
                       ItemToFree->ReferenceCount, Stream->QueuedTimestepCount);
            ItemToFree->FreeTimestep(ItemToFree->FreeClientData);
            free(ItemToFree->Msg);
            //            free(ItemToFree->MetadataArray);
            //            free(ItemToFree->DP_TimestepInfo);
            free(ItemToFree->DataBlockToFree);
            free(ItemToFree);
            AnythingRemoved++;

            if (Last)
            {
                /* unlink item */
                Last->Next = Next;
            }
            else
            {
                Stream->QueuedTimesteps = Next;
            }
        }
        if (!Freed)
        {
            Last = List;
        }
        List = Next;
    }

    if (AnythingRemoved)
    {
        /* main thread might be waiting on timesteps going away */
        STREAM_CONDITION_SIGNAL(Stream);
    }
}